

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SHA1.cpp
# Opt level: O2

void __thiscall CSHA1::Final(CSHA1 *this)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  uchar *data;
  uchar local_28 [8];
  
  bVar1 = 0;
  for (uVar2 = 0; uVar2 != 8; uVar2 = uVar2 + 1) {
    local_28[uVar2] = (uchar)(this->m_count[uVar2 < 4] >> (~bVar1 & 0x18));
    bVar1 = bVar1 + 8;
  }
  data = (uchar *)anon_var_dwarf_c27b2;
  do {
    Update(this,data,1);
    data = (uchar *)"";
  } while ((this->m_count[0] & 0x1f8) != 0x1c0);
  Update(this,local_28,8);
  bVar1 = 0;
  for (lVar3 = 0; lVar3 != 0x14; lVar3 = lVar3 + 1) {
    this->m_digest[lVar3] =
         (uchar)(*(uint *)((long)this->m_state + (ulong)((uint)lVar3 & 0xfffffffc)) >>
                (~bVar1 & 0x18));
    bVar1 = bVar1 + 8;
  }
  this->m_buffer[0x30] = '\0';
  this->m_buffer[0x31] = '\0';
  this->m_buffer[0x32] = '\0';
  this->m_buffer[0x33] = '\0';
  this->m_buffer[0x34] = '\0';
  this->m_buffer[0x35] = '\0';
  this->m_buffer[0x36] = '\0';
  this->m_buffer[0x37] = '\0';
  this->m_buffer[0x38] = '\0';
  this->m_buffer[0x39] = '\0';
  this->m_buffer[0x3a] = '\0';
  this->m_buffer[0x3b] = '\0';
  this->m_buffer[0x3c] = '\0';
  this->m_buffer[0x3d] = '\0';
  this->m_buffer[0x3e] = '\0';
  this->m_buffer[0x3f] = '\0';
  this->m_buffer[0x20] = '\0';
  this->m_buffer[0x21] = '\0';
  this->m_buffer[0x22] = '\0';
  this->m_buffer[0x23] = '\0';
  this->m_buffer[0x24] = '\0';
  this->m_buffer[0x25] = '\0';
  this->m_buffer[0x26] = '\0';
  this->m_buffer[0x27] = '\0';
  this->m_buffer[0x28] = '\0';
  this->m_buffer[0x29] = '\0';
  this->m_buffer[0x2a] = '\0';
  this->m_buffer[0x2b] = '\0';
  this->m_buffer[0x2c] = '\0';
  this->m_buffer[0x2d] = '\0';
  this->m_buffer[0x2e] = '\0';
  this->m_buffer[0x2f] = '\0';
  this->m_buffer[0x10] = '\0';
  this->m_buffer[0x11] = '\0';
  this->m_buffer[0x12] = '\0';
  this->m_buffer[0x13] = '\0';
  this->m_buffer[0x14] = '\0';
  this->m_buffer[0x15] = '\0';
  this->m_buffer[0x16] = '\0';
  this->m_buffer[0x17] = '\0';
  this->m_buffer[0x18] = '\0';
  this->m_buffer[0x19] = '\0';
  this->m_buffer[0x1a] = '\0';
  this->m_buffer[0x1b] = '\0';
  this->m_buffer[0x1c] = '\0';
  this->m_buffer[0x1d] = '\0';
  this->m_buffer[0x1e] = '\0';
  this->m_buffer[0x1f] = '\0';
  this->m_buffer[0] = '\0';
  this->m_buffer[1] = '\0';
  this->m_buffer[2] = '\0';
  this->m_buffer[3] = '\0';
  this->m_buffer[4] = '\0';
  this->m_buffer[5] = '\0';
  this->m_buffer[6] = '\0';
  this->m_buffer[7] = '\0';
  this->m_buffer[8] = '\0';
  this->m_buffer[9] = '\0';
  this->m_buffer[10] = '\0';
  this->m_buffer[0xb] = '\0';
  this->m_buffer[0xc] = '\0';
  this->m_buffer[0xd] = '\0';
  this->m_buffer[0xe] = '\0';
  this->m_buffer[0xf] = '\0';
  this->m_state[0] = 0;
  this->m_state[1] = 0;
  this->m_state[2] = 0;
  this->m_state[3] = 0;
  this->m_state[3] = 0;
  this->m_state[4] = 0;
  this->m_count[0] = 0;
  this->m_count[1] = 0;
  Transform(this,this->m_state,this->m_buffer);
  return;
}

Assistant:

void CSHA1::Final()
{
	UINT_32 i;
	UINT_8 finalcount[8];

	for(i = 0; i < 8; i++)
		finalcount[i] = (UINT_8)((m_count[((i >= 4) ? 0 : 1)]
			>> ((3 - (i & 3)) * 8) ) & 255); // Endian independent

	Update((UINT_8 *)"\200", 1);

	while ((m_count[0] & 504) != 448)
		Update((UINT_8 *)"\0", 1);

	Update(finalcount, 8); // Cause a SHA1Transform()

	for(i = 0; i < 20; i++)
	{
		m_digest[i] = (UINT_8)((m_state[i >> 2] >> ((3 - (i & 3)) * 8) ) & 255);
	}

	// Wipe variables for security reasons
#ifdef SHA1_WIPE_VARIABLES
	i = 0;
	memset(m_buffer, 0, 64);
	memset(m_state, 0, 20);
	memset(m_count, 0, 8);
	memset(finalcount, 0, 8);
	Transform(m_state, m_buffer);
#endif
}